

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber-unix.cpp
# Opt level: O1

void __thiscall
cilk_fiber_sysdep::suspend_self_and_resume_other_sysdep
          (cilk_fiber_sysdep *this,cilk_fiber_sysdep *other)

{
  uint uVar1;
  undefined1 auStack_48 [8];
  cilk_fiber_sysdep *local_40;
  cilk_fiber_sysdep *local_38;
  
  if (((this->super_cilk_fiber).m_flags & 1) == 0) {
    suspend_self_and_resume_other_sysdep();
  }
  else {
    this->m_resume_jmpbuf[0] = &stack0xfffffffffffffff8;
    this->m_resume_jmpbuf[2] = auStack_48;
    this->m_resume_jmpbuf[1] = &DAT_0010f9f8;
    local_40 = this;
    local_38 = other;
  }
  uVar1 = (local_38->super_cilk_fiber).m_flags;
  if ((uVar1 & 1) != 0) {
    (local_38->super_cilk_fiber).m_flags = uVar1 & 0xfffffffe;
    (*(code *)local_38->m_resume_jmpbuf[1])();
    return;
  }
  run(local_38);
}

Assistant:

void cilk_fiber_sysdep::suspend_self_and_resume_other_sysdep(cilk_fiber_sysdep* other)
{
#if SUPPORT_GET_CURRENT_FIBER
    cilkos_set_tls_cilk_fiber(other);
#endif
    CILK_ASSERT(this->is_resumable());


    // Jump to the other fiber.  We expect to come back.
    if (! CILK_SETJMP(m_resume_jmpbuf)) {
        resume_other_sysdep(other);
    }

    // Return here when another fiber resumes me.
    // If the fiber that switched to me wants to be deallocated, do it now.
    do_post_switch_actions();
}